

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void get_ls_tile_buffer(uint8_t *data_end,aom_internal_error_info *error_info,uint8_t **data,
                       TileBufferDec (*tile_buffers) [64],int tile_size_bytes,int col,int row,
                       int tile_copy_mode)

{
  char cVar1;
  uchar *mem;
  uint *puVar2;
  byte *pbVar3;
  uint8_t *puVar4;
  TileBufferDec *pTVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  
  puVar2 = (uint *)*data;
  lVar6 = (long)tile_size_bytes;
  if ((ulong)((long)data_end - (long)puVar2) <= lVar6 - 1U) {
    aom_internal_error(error_info,AOM_CODEC_CORRUPT_FRAME,"Truncated packet or corrupt tile length")
    ;
    puVar2 = (uint *)*data;
  }
  switch(tile_size_bytes) {
  case 1:
    uVar8 = (ulong)(byte)*puVar2;
    break;
  case 2:
    uVar8 = (ulong)(ushort)*puVar2;
    break;
  case 3:
    uVar8 = (ulong)(uint3)*puVar2;
    break;
  case 4:
    uVar8 = (ulong)*puVar2;
    break;
  default:
    uVar8 = 0xffffffffffffffff;
  }
  if ((tile_copy_mode == 0) ||
     (cVar1 = (char)tile_size_bytes * '\b', uVar8 >> (cVar1 - 1U & 0x3f) != 1)) {
    uVar8 = uVar8 + 1;
    pbVar3 = (byte *)((long)puVar2 + lVar6);
    *data = pbVar3;
    if ((ulong)((long)data_end - (long)pbVar3) < uVar8) {
      aom_internal_error(error_info,AOM_CODEC_CORRUPT_FRAME,"Truncated packet or corrupt tile size")
      ;
      pbVar3 = *data;
    }
    else if (uVar8 == 0) {
      sVar9 = 0;
      puVar4 = (uint8_t *)0x0;
      goto LAB_001783c2;
    }
    pTVar5 = tile_buffers[row] + col;
    tile_buffers[row][col].data = pbVar3;
    sVar9 = uVar8;
  }
  else {
    uVar7 = (uint)(uVar8 >> (cVar1 - 8U & 0x3f)) & 0x7f;
    if (row < (int)uVar7) {
      aom_internal_error(error_info,AOM_CODEC_CORRUPT_FRAME,
                         "Invalid row offset in tile copy mode: row=%d offset=%d",(ulong)(uint)row,
                         (ulong)uVar7);
      puVar2 = (uint *)*data;
    }
    puVar4 = tile_buffers[(int)(row - uVar7)][col].data;
    sVar9 = tile_buffers[(int)(row - uVar7)][col].size;
    *data = (byte *)((long)puVar2 + lVar6);
LAB_001783c2:
    pTVar5 = tile_buffers[row] + col;
    tile_buffers[row][col].data = puVar4;
    uVar8 = 0;
  }
  pTVar5->size = sVar9;
  *data = *data + uVar8;
  return;
}

Assistant:

static inline void get_ls_tile_buffer(
    const uint8_t *const data_end, struct aom_internal_error_info *error_info,
    const uint8_t **data, TileBufferDec (*const tile_buffers)[MAX_TILE_COLS],
    int tile_size_bytes, int col, int row, int tile_copy_mode) {
  size_t size;

  size_t copy_size = 0;
  const uint8_t *copy_data = NULL;

  if (!read_is_valid(*data, tile_size_bytes, data_end))
    aom_internal_error(error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Truncated packet or corrupt tile length");
  size = mem_get_varsize(*data, tile_size_bytes);

  // If tile_copy_mode = 1, then the top bit of the tile header indicates copy
  // mode.
  if (tile_copy_mode && (size >> (tile_size_bytes * 8 - 1)) == 1) {
    // The remaining bits in the top byte signal the row offset
    int offset = (size >> (tile_size_bytes - 1) * 8) & 0x7f;
    if (offset > row) {
      aom_internal_error(
          error_info, AOM_CODEC_CORRUPT_FRAME,
          "Invalid row offset in tile copy mode: row=%d offset=%d", row,
          offset);
    }

    // Currently, only use tiles in same column as reference tiles.
    copy_data = tile_buffers[row - offset][col].data;
    copy_size = tile_buffers[row - offset][col].size;
    size = 0;
  } else {
    size += AV1_MIN_TILE_SIZE_BYTES;
  }

  *data += tile_size_bytes;

  if (size > (size_t)(data_end - *data))
    aom_internal_error(error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Truncated packet or corrupt tile size");

  if (size > 0) {
    tile_buffers[row][col].data = *data;
    tile_buffers[row][col].size = size;
  } else {
    tile_buffers[row][col].data = copy_data;
    tile_buffers[row][col].size = copy_size;
  }

  *data += size;
}